

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parg.hh
# Opt level: O0

void __thiscall OB::Parg::argvf(Parg *this,char **_argv)

{
  int local_1c;
  int i;
  char **_argv_local;
  Parg *this_local;
  
  if (0 < this->argc_) {
    for (local_1c = 1; local_1c < this->argc_; local_1c = local_1c + 1) {
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::emplace_back<char*&>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&this->argv_,
                 _argv + local_1c);
    }
    this->argc_ = this->argc_ + -1;
  }
  return;
}

Assistant:

void argvf(char** _argv)
  {
    // std::cout << "argc: " << argc_ << std::endl;
    // removes first arg
    if (argc_ < 1) return;
    for (int i = 1; i < argc_; ++i)
    {
      argv_.emplace_back(_argv[i]);
      // std::cout << "argv: " << i << " -> " << argv_.at(i) << std::endl;
    }
    --argc_;
  }